

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_gej_add_var(secp256k1_gej *r,secp256k1_gej *a,secp256k1_gej *b,secp256k1_fe *rzr)

{
  secp256k1_fe *a_00;
  secp256k1_fe *a_01;
  undefined8 uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  int iVar9;
  long lVar10;
  secp256k1_fe *rzr_00;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  secp256k1_fe s1;
  secp256k1_fe u1;
  secp256k1_fe z22;
  secp256k1_fe u2;
  secp256k1_fe z12;
  secp256k1_fe t;
  secp256k1_fe i2;
  secp256k1_fe s2;
  secp256k1_fe h2;
  secp256k1_fe local_248;
  secp256k1_fe local_218;
  secp256k1_fe local_1e8;
  secp256k1_fe local_1c0;
  secp256k1_fe local_198;
  secp256k1_fe local_168;
  secp256k1_fe local_140;
  secp256k1_fe local_118;
  secp256k1_fe local_e8;
  secp256k1_fe local_b8;
  secp256k1_fe local_88;
  secp256k1_fe local_58;
  
  if (a->infinity == 0) {
    if (b->infinity == 0) {
      r->infinity = 0;
      a_00 = &b->z;
      secp256k1_fe_sqr(&local_1c0,a_00);
      a_01 = &a->z;
      secp256k1_fe_sqr(&local_140,a_01);
      secp256k1_fe_mul(&local_1e8,&a->x,&local_1c0);
      secp256k1_fe_mul(&local_168,&b->x,&local_140);
      secp256k1_fe_mul(&local_218,&a->y,&local_1c0);
      secp256k1_fe_mul(&local_218,&local_218,a_00);
      secp256k1_fe_mul(&local_88,&b->y,&local_140);
      secp256k1_fe_mul(&local_88,&local_88,a_01);
      local_198.n[0] = (local_168.n[0] - local_1e8.n[0]) + 0xffff0bc;
      local_198.n[1] = (local_168.n[1] - local_1e8.n[1]) + 0xffffefc;
      local_198.n[2] = (local_168.n[2] - local_1e8.n[2]) + 0xffffffc;
      local_198.n[3] = (local_168.n[3] - local_1e8.n[3]) + 0xffffffc;
      local_198.n[4] = (local_168.n[4] - local_1e8.n[4]) + 0xffffffc;
      local_198.n[5] = (local_168.n[5] - local_1e8.n[5]) + 0xffffffc;
      local_198.n[6] = (local_168.n[6] - local_1e8.n[6]) + 0xffffffc;
      local_198.n[7] = (local_168.n[7] - local_1e8.n[7]) + 0xffffffc;
      local_198.n[8] = (local_168.n[8] - local_1e8.n[8]) + 0xffffffc;
      local_198.n[9] = (local_168.n[9] - local_1e8.n[9]) + 0xfffffc;
      local_248.n[0] = (local_88.n[0] - local_218.n[0]) + 0xffff0bc;
      local_248.n[1] = (local_88.n[1] - local_218.n[1]) + 0xffffefc;
      local_248.n[2] = (local_88.n[2] - local_218.n[2]) + 0xffffffc;
      local_248.n[3] = (local_88.n[3] - local_218.n[3]) + 0xffffffc;
      local_248.n[4] = (local_88.n[4] - local_218.n[4]) + 0xffffffc;
      local_248.n[5] = (local_88.n[5] - local_218.n[5]) + 0xffffffc;
      local_248.n[6] = (local_88.n[6] - local_218.n[6]) + 0xffffffc;
      local_248.n[7] = (local_88.n[7] - local_218.n[7]) + 0xffffffc;
      local_248.n[8] = (local_88.n[8] - local_218.n[8]) + 0xffffffc;
      local_248.n[9] = (local_88.n[9] - local_218.n[9]) + 0xfffffc;
      iVar9 = secp256k1_fe_normalizes_to_zero_var(&local_198);
      if (iVar9 == 0) {
        secp256k1_fe_sqr(&local_b8,&local_248);
        secp256k1_fe_sqr(&local_58,&local_198);
        secp256k1_fe_mul(&local_e8,&local_198,&local_58);
        secp256k1_fe_mul(&local_198,&local_198,a_00);
        secp256k1_fe_mul(&r->z,a_01,&local_198);
        secp256k1_fe_mul(&local_118,&local_1e8,&local_58);
        *(ulong *)((r->x).n + 8) = CONCAT44(local_118.n[9],local_118.n[8]);
        *(ulong *)((r->x).n + 4) = CONCAT44(local_118.n[5],local_118.n[4]);
        *(ulong *)((r->x).n + 6) = CONCAT44(local_118.n[7],local_118.n[6]);
        *(undefined8 *)(r->x).n = local_118.n._0_8_;
        *(ulong *)((r->x).n + 2) = CONCAT44(local_118.n[3],local_118.n[2]);
        iVar9 = local_b8.n[0] - ((r->x).n[0] * 2 + local_e8.n[0]);
        iVar11 = local_b8.n[1] - ((r->x).n[1] * 2 + local_e8.n[1]);
        iVar12 = local_b8.n[2] - ((r->x).n[2] * 2 + local_e8.n[2]);
        iVar13 = local_b8.n[3] - ((r->x).n[3] * 2 + local_e8.n[3]);
        (r->x).n[0] = iVar9 + 0x1fffe178;
        (r->x).n[1] = iVar11 + 0x1ffffdf8;
        (r->x).n[2] = iVar12 + 0x1ffffff8;
        (r->x).n[3] = iVar13 + 0x1ffffff8;
        iVar16 = local_b8.n[4] - ((r->x).n[4] * 2 + local_e8.n[4]);
        iVar17 = local_b8.n[5] - ((r->x).n[5] * 2 + local_e8.n[5]);
        iVar18 = local_b8.n[6] - ((r->x).n[6] * 2 + local_e8.n[6]);
        iVar19 = local_b8.n[7] - ((r->x).n[7] * 2 + local_e8.n[7]);
        (r->x).n[4] = iVar16 + 0x1ffffff8;
        (r->x).n[5] = iVar17 + 0x1ffffff8;
        (r->x).n[6] = iVar18 + 0x1ffffff8;
        (r->x).n[7] = iVar19 + 0x1ffffff8;
        iVar14 = local_b8.n[8] - (local_e8.n[8] + local_118.n[8] * 2);
        iVar15 = local_b8.n[9] - (local_e8.n[9] + local_118.n[9] * 2);
        (r->x).n[8] = iVar14 + 0x1ffffff8;
        (r->x).n[9] = iVar15 + 0x1fffff8;
        (r->y).n[0] = (local_118.n[0] - iVar9) + 0xffff0bc;
        (r->y).n[1] = (local_118.n[1] - iVar11) + 0xffffefc;
        (r->y).n[2] = (local_118.n[2] - iVar12) + 0xffffffc;
        (r->y).n[3] = (local_118.n[3] - iVar13) + 0xffffffc;
        (r->y).n[4] = (local_118.n[4] - iVar16) + 0xffffffc;
        (r->y).n[5] = (local_118.n[5] - iVar17) + 0xffffffc;
        (r->y).n[6] = (local_118.n[6] - iVar18) + 0xffffffc;
        (r->y).n[7] = (local_118.n[7] - iVar19) + 0xffffffc;
        (r->y).n[8] = (local_118.n[8] - iVar14) + 0xffffffc;
        (r->y).n[9] = (local_118.n[9] - iVar15) + 0xfffffc;
        secp256k1_fe_mul(&r->y,&r->y,&local_248);
        secp256k1_fe_mul(&local_e8,&local_e8,&local_218);
        uVar2 = (r->y).n[1];
        uVar3 = (r->y).n[2];
        uVar4 = (r->y).n[3];
        uVar5 = (r->y).n[4];
        uVar6 = (r->y).n[5];
        uVar7 = (r->y).n[6];
        uVar8 = (r->y).n[7];
        (r->y).n[0] = ((r->y).n[0] - local_e8.n[0]) + 0xffff0bc;
        (r->y).n[1] = (uVar2 - local_e8.n[1]) + 0xffffefc;
        (r->y).n[2] = (uVar3 - local_e8.n[2]) + 0xffffffc;
        (r->y).n[3] = (uVar4 - local_e8.n[3]) + 0xffffffc;
        (r->y).n[4] = (uVar5 - local_e8.n[4]) + 0xffffffc;
        (r->y).n[5] = (uVar6 - local_e8.n[5]) + 0xffffffc;
        (r->y).n[6] = (uVar7 - local_e8.n[6]) + 0xffffffc;
        (r->y).n[7] = (uVar8 - local_e8.n[7]) + 0xffffffc;
        uVar1 = *(undefined8 *)((r->y).n + 8);
        *(ulong *)((r->y).n + 8) =
             CONCAT44(((int)((ulong)uVar1 >> 0x20) - local_e8.n[9]) + 0xfffffc,
                      ((int)uVar1 - local_e8.n[8]) + 0xffffffc);
        return;
      }
      iVar9 = secp256k1_fe_normalizes_to_zero_var(&local_248);
      if (iVar9 == 0) {
        r->infinity = 1;
        return;
      }
      secp256k1_gej_double_var(r,a,rzr_00);
      return;
    }
    lVar10 = 0x1f;
  }
  else {
    lVar10 = 0x1f;
    a = b;
  }
  for (; lVar10 != 0; lVar10 = lVar10 + -1) {
    (r->x).n[0] = (a->x).n[0];
    a = (secp256k1_gej *)((a->x).n + 1);
    r = (secp256k1_gej *)((r->x).n + 1);
  }
  return;
}

Assistant:

static void secp256k1_gej_add_var(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_gej *b, secp256k1_fe *rzr) {
    /* Operations: 12 mul, 4 sqr, 2 normalize, 12 mul_int/add/negate */
    secp256k1_fe z22, z12, u1, u2, s1, s2, h, i, i2, h2, h3, t;

    if (a->infinity) {
        VERIFY_CHECK(rzr == NULL);
        *r = *b;
        return;
    }

    if (b->infinity) {
        if (rzr != NULL) {
            secp256k1_fe_set_int(rzr, 1);
        }
        *r = *a;
        return;
    }

    r->infinity = 0;
    secp256k1_fe_sqr(&z22, &b->z);
    secp256k1_fe_sqr(&z12, &a->z);
    secp256k1_fe_mul(&u1, &a->x, &z22);
    secp256k1_fe_mul(&u2, &b->x, &z12);
    secp256k1_fe_mul(&s1, &a->y, &z22); secp256k1_fe_mul(&s1, &s1, &b->z);
    secp256k1_fe_mul(&s2, &b->y, &z12); secp256k1_fe_mul(&s2, &s2, &a->z);
    secp256k1_fe_negate(&h, &u1, 1); secp256k1_fe_add(&h, &u2);
    secp256k1_fe_negate(&i, &s1, 1); secp256k1_fe_add(&i, &s2);
    if (secp256k1_fe_normalizes_to_zero_var(&h)) {
        if (secp256k1_fe_normalizes_to_zero_var(&i)) {
            secp256k1_gej_double_var(r, a, rzr);
        } else {
            if (rzr != NULL) {
                secp256k1_fe_set_int(rzr, 0);
            }
            r->infinity = 1;
        }
        return;
    }
    secp256k1_fe_sqr(&i2, &i);
    secp256k1_fe_sqr(&h2, &h);
    secp256k1_fe_mul(&h3, &h, &h2);
    secp256k1_fe_mul(&h, &h, &b->z);
    if (rzr != NULL) {
        *rzr = h;
    }
    secp256k1_fe_mul(&r->z, &a->z, &h);
    secp256k1_fe_mul(&t, &u1, &h2);
    r->x = t; secp256k1_fe_mul_int(&r->x, 2); secp256k1_fe_add(&r->x, &h3); secp256k1_fe_negate(&r->x, &r->x, 3); secp256k1_fe_add(&r->x, &i2);
    secp256k1_fe_negate(&r->y, &r->x, 5); secp256k1_fe_add(&r->y, &t); secp256k1_fe_mul(&r->y, &r->y, &i);
    secp256k1_fe_mul(&h3, &h3, &s1); secp256k1_fe_negate(&h3, &h3, 1);
    secp256k1_fe_add(&r->y, &h3);
}